

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_> *
__thiscall
pybind11::move<std::__cxx11::string>
          (enable_if_t<_detail::move_never<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
           *__return_storage_ptr__,pybind11 *this,object *obj)

{
  ssize_t sVar1;
  cast_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  handle *handle;
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_128;
  undefined1 local_102;
  undefined1 local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  PyObject *local_d0;
  PyObject *local_c8;
  object local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  detail *local_18;
  object *obj_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  
  local_18 = (detail *)this;
  obj_local = (object *)__return_storage_ptr__;
  sVar1 = detail::object_api<pybind11::handle>::ref_count((object_api<pybind11::handle> *)this);
  if (sVar1 < 2) {
    local_102 = 0;
    detail::load_type<std::__cxx11::string>
              ((make_caster<std::__cxx11::basic_string<char>_> *)&local_128,local_18,handle);
    pbVar2 = detail::string_caster::operator_cast_to_string_((string_caster *)&local_128);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
    detail::
    type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~type_caster(&local_128);
    return __return_storage_ptr__;
  }
  local_101 = 1;
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  local_d0 = *(PyObject **)local_18;
  local_c8 = (PyObject *)type::handle_of((handle)local_d0);
  str::str((str *)&local_c0,(handle)local_c8);
  object::cast<std::__cxx11::string>(&local_b8,&local_c0);
  std::operator+(&local_98,"Unable to move from Python ",&local_b8);
  std::operator+(&local_78,&local_98," instance to C++ ");
  type_id<std::__cxx11::string>();
  std::operator+(&local_58,&local_78,&local_100);
  std::operator+(&local_38,&local_58," instance: instance has multiple references");
  cast_error::runtime_error(this_00,&local_38);
  local_101 = 0;
  __cxa_throw(this_00,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1) {
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
        throw cast_error(
            "Unable to cast Python " + str(type::handle_of(obj)).cast<std::string>()
            + " instance to C++ rvalue: instance has multiple references"
              " (#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python "
                         + str(type::handle_of(obj)).cast<std::string>() + " instance to C++ "
                         + type_id<T>() + " instance: instance has multiple references");
#endif
    }

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T &());
    return ret;
}